

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O3

void Gia_ManEquivImprove(Gia_Man_t *p)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint local_40;
  int local_3c;
  
  if ((p->pReprs == (Gia_Rpr_t *)0x0) || (p->pNexts == (int *)0x0)) {
    __assert_fail("p->pReprs != NULL && p->pNexts != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaEquiv.c"
                  ,0x616,"void Gia_ManEquivImprove(Gia_Man_t *)");
  }
  Gia_ManLevelNum(p);
  Gia_ManCreateRefs(p);
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  piVar4 = (int *)malloc(400);
  p_00->pArray = piVar4;
  if (1 < p->nObjs) {
    uVar11 = 1;
    do {
      if (((~(uint)p->pReprs[uVar11] & 0xfffffff) == 0) && (0 < p->pNexts[uVar11])) {
        p_00->nSize = 0;
        local_40 = 0xffffffff;
        local_3c = 1000000000;
        iVar7 = 1000000000;
        uVar6 = uVar11;
        do {
          uVar10 = (uint)uVar6;
          if (p->nObjs <= (int)uVar10) goto LAB_001fdca2;
          pVVar1 = p->vLevels;
          iVar2 = pVVar1->nSize;
          if (iVar2 <= (int)uVar10) {
            uVar8 = uVar10 + 1;
            iVar3 = pVVar1->nCap;
            if ((int)uVar10 < iVar3 * 2) {
              if (iVar3 <= (int)uVar10) {
                if (pVVar1->pArray == (int *)0x0) {
                  piVar4 = (int *)malloc((long)iVar3 << 3);
                }
                else {
                  piVar4 = (int *)realloc(pVVar1->pArray,(long)iVar3 << 3);
                }
                pVVar1->pArray = piVar4;
                uVar5 = iVar3 * 2;
                goto LAB_001fdb07;
              }
            }
            else {
              if (pVVar1->pArray == (int *)0x0) {
                piVar4 = (int *)malloc((ulong)uVar8 << 2);
              }
              else {
                piVar4 = (int *)realloc(pVVar1->pArray,(ulong)uVar8 << 2);
              }
              pVVar1->pArray = piVar4;
              uVar5 = uVar8;
LAB_001fdb07:
              if (piVar4 == (int *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                              ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
              pVVar1->nCap = uVar5;
              iVar2 = pVVar1->nSize;
            }
            if (iVar2 <= (int)uVar10) {
              memset(pVVar1->pArray + iVar2,0,(ulong)(uVar10 - iVar2) * 4 + 4);
            }
            pVVar1->nSize = uVar8;
          }
          if (p->nObjs <= (int)uVar10) {
LAB_001fdca2:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                          ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          uVar9 = uVar6 & 0xffffffff;
          iVar2 = pVVar1->pArray[uVar9];
          iVar3 = Gia_NodeMffcSize(p,p->pObjs + uVar9);
          if ((iVar2 < iVar7) || ((iVar7 == iVar2 && (iVar3 < local_3c)))) {
            iVar7 = iVar2;
            local_40 = uVar10;
            local_3c = iVar3;
          }
          Vec_IntPush(p_00,uVar10);
          uVar6 = (ulong)(uint)p->pNexts[uVar9];
        } while (0 < p->pNexts[uVar9]);
        uVar10 = p_00->nSize;
        if ((int)uVar10 < 2) {
          __assert_fail("Vec_IntSize( vClass ) > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaEquiv.c"
                        ,0x62c,"void Gia_ManEquivImprove(Gia_Man_t *)");
        }
        if ((int)local_40 < 1) {
          __assert_fail("iReprBest > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaEquiv.c"
                        ,0x62d,"void Gia_ManEquivImprove(Gia_Man_t *)");
        }
        uVar6 = (ulong)local_40;
        if (uVar11 != uVar6) {
          p->pReprs[uVar6] = (Gia_Rpr_t)((uint)p->pReprs[uVar6] | 0xfffffff);
          p->pReprs[uVar11] = (Gia_Rpr_t)((uint)p->pReprs[uVar11] | 0x10000000);
          p->pReprs[uVar6] = (Gia_Rpr_t)((uint)p->pReprs[uVar6] & 0xefffffff);
          piVar4 = p_00->pArray;
          uVar6 = 0;
          do {
            uVar8 = piVar4[uVar6];
            if (uVar8 != local_40) {
              if ((local_40 != 0xfffffff) && ((int)uVar8 <= (int)local_40)) {
                __assert_fail("Num == GIA_VOID || Num < Id",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                              ,0x3fc,"void Gia_ObjSetRepr(Gia_Man_t *, int, int)");
              }
              p->pReprs[(int)uVar8] =
                   (Gia_Rpr_t)((uint)p->pReprs[(int)uVar8] & 0xf0000000 | local_40 & 0xfffffff);
            }
            uVar6 = uVar6 + 1;
          } while (uVar10 != uVar6);
        }
      }
      uVar11 = uVar11 + 1;
    } while ((long)uVar11 < (long)p->nObjs);
    piVar4 = p_00->pArray;
  }
  if (piVar4 != (int *)0x0) {
    free(piVar4);
  }
  free(p_00);
  if (p->pNexts != (int *)0x0) {
    free(p->pNexts);
    p->pNexts = (int *)0x0;
  }
  return;
}

Assistant:

void Gia_ManEquivImprove( Gia_Man_t * p )
{
    Vec_Int_t * vClass;
    int i, k, iNode, iRepr;
    int iReprBest, iLevelBest, iLevelCur, iMffcBest, iMffcCur;
    assert( p->pReprs != NULL && p->pNexts != NULL );
    Gia_ManLevelNum( p );
    Gia_ManCreateRefs( p );
    // iterate over class candidates
    vClass = Vec_IntAlloc( 100 );
    Gia_ManForEachClass( p, i )
    {
        Vec_IntClear( vClass );
        iReprBest = -1;
        iLevelBest = iMffcBest = ABC_INFINITY;
        Gia_ClassForEachObj( p, i, k )
        {
            iLevelCur = Gia_ObjLevel( p,Gia_ManObj(p, k) );
            iMffcCur  = Gia_NodeMffcSize( p, Gia_ManObj(p, k) );
            if ( iLevelBest > iLevelCur || (iLevelBest == iLevelCur && iMffcBest > iMffcCur) )
            {
                iReprBest  = k;
                iLevelBest = iLevelCur;
                iMffcBest  = iMffcCur;
            }
            Vec_IntPush( vClass, k );
        }
        assert( Vec_IntSize( vClass ) > 1 );
        assert( iReprBest > 0 );
        if ( i == iReprBest )
            continue;
/*
        Abc_Print( 1, "Repr/Best = %6d/%6d. Lev = %3d/%3d. Mffc = %3d/%3d.\n", 
            i, iReprBest, Gia_ObjLevel( p,Gia_ManObj(p, i) ), Gia_ObjLevel( p,Gia_ManObj(p, iReprBest) ),
            Gia_NodeMffcSize( p, Gia_ManObj(p, i) ), Gia_NodeMffcSize( p, Gia_ManObj(p, iReprBest) ) );
*/
        iRepr = iReprBest;
        Gia_ObjSetRepr( p, iRepr, GIA_VOID );
        Gia_ObjSetProved( p, i );
        Gia_ObjUnsetProved( p, iRepr );
        Vec_IntForEachEntry( vClass, iNode, k )
            if ( iNode != iRepr )
                Gia_ObjSetRepr( p, iNode, iRepr );
    }
    Vec_IntFree( vClass );
    ABC_FREE( p->pNexts );
//    p->pNexts = Gia_ManDeriveNexts( p );
}